

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O3

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  SidAddress *sidAddress;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  Animatable *pAVar4;
  DocumentProcessor *pDVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  UniqueId *uniqueId;
  Formula *__from_00;
  FragmentExpression *pFVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SidTreeNode *pSVar10;
  undefined4 extraout_var_01;
  long *plVar11;
  undefined4 extraout_var_02;
  char *in_RCX;
  long *plVar12;
  size_type *psVar13;
  String *parameterName;
  Animatable *pAVar14;
  String *name;
  long lVar15;
  bool fragmentSuccess;
  String local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  char *local_d0;
  String local_c8;
  FormulasLinker *local_a8;
  FragmentExpression *local_a0;
  char *local_98;
  String local_90;
  String local_70;
  String local_50;
  
  if ((*(long *)(__to + 0x18) == 0) || (*(long *)(__to + 0x30) != *(long *)(__to + 0x38))) {
    parameterName = (String *)0x0;
  }
  else {
    parameterName = (String *)0x0;
    if (*(int *)(__to + 0x48) == 0) {
      parameterName = (String *)(__to + 0x10);
    }
  }
  sidAddress = (SidAddress *)(__to + 8);
  local_d0 = in_RCX;
  if (*(int *)(__to + 0xc0) == 1) {
    local_98 = __from;
    uniqueId = COLLADACsymbol::getFormulaUniqueId((COLLADACsymbol *)__to);
    local_a8 = this;
    __from_00 = DocumentProcessor::getFormulaByUniqueId(this->mDocumentProcessor,uniqueId);
    if (__from_00 == (Formula *)0x0) {
      pFVar9 = (FragmentExpression *)operator_new(200);
      SidAddress::getSidAddressString_abi_cxx11_(&local_110,sidAddress);
      MathML::AST::FragmentExpression::FragmentExpression
                (pFVar9,&local_110,CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);
      paVar1 = &local_110.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      COLLADAFW::UniqueId::toAscii_abi_cxx11_(&local_c8,uniqueId);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x837c4b);
      plVar12 = plVar11 + 2;
      if ((long *)*plVar11 == plVar12) {
        local_e0 = *plVar12;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar12;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_110.field_2._M_allocated_capacity = *psVar13;
        local_110.field_2._8_8_ = plVar11[3];
        local_110._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar13;
        local_110._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_110._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_110);
      pDVar5 = local_a8->mDocumentProcessor;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      bVar6 = IFilePartLoader::handleFWLError
                        (&pDVar5->super_IFilePartLoader,ERROR_UNRESOLVED_FORMULA,&local_70,
                         SEVERITY_ERROR_NONCRITICAL);
      *local_d0 = bVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_a0 = pFVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar1) goto LAB_00794a76;
    }
    else {
      name = &__from_00->mName;
      if (parameterName != (String *)0x0) {
        name = parameterName;
      }
      pFVar9 = (FragmentExpression *)operator_new(200);
      MathML::AST::FragmentExpression::FragmentExpression
                (pFVar9,name,CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);
      if ((__from_00->mMathmlAsts).mCount == 1) {
        local_110._M_dataplus._M_p._0_1_ = 1;
        iVar8 = link(local_a8,(char *)__from_00,(char *)*(__from_00->mMathmlAsts).mData);
        *(__from_00->mMathmlAsts).mData = (INode *)CONCAT44(extraout_var,iVar8);
        (*(pFVar9->super_INode)._vptr_INode[7])(pFVar9,*(__from_00->mMathmlAsts).mData);
        if ((char)local_110._M_dataplus._M_p == '\0') {
          local_a0 = (FragmentExpression *)0x0;
          goto LAB_00794a76;
        }
      }
      lVar2 = *(long *)(__to + 200);
      local_a0 = pFVar9;
      if (*(long *)(__to + 0xd0) - lVar2 >> 3 ==
          (__from_00->mNewParams).super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>.mCount) {
        if (lVar2 != *(long *)(__to + 0xd0)) {
          lVar15 = 0;
          do {
            lVar3 = *(long *)((long)(__from_00->mNewParams).
                                    super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>.mData +
                             lVar15);
            iVar8 = link(local_a8,local_98,*(char **)(lVar2 + lVar15));
            (*(local_a0->super_INode)._vptr_INode[0xe])
                      (local_a0,lVar3 + 0x18,CONCAT44(extraout_var_00,iVar8));
            if (*local_d0 != '\x01') break;
            lVar3 = lVar2 + lVar15;
            lVar15 = lVar15 + 8;
          } while (lVar3 + 8 != *(long *)(__to + 0xd0));
        }
        goto LAB_00794a76;
      }
      std::operator+(&local_110,"Number of newparams in formula \"",name);
      if (*(long *)(local_98 + 0x90) != 0) {
        std::operator+(&local_c8,"referenced in \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_98 + 0x88));
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_c8);
        plVar12 = plVar11 + 2;
        if ((long *)*plVar11 == plVar12) {
          local_e0 = *plVar12;
          lStack_d8 = plVar11[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar12;
          local_f0 = (long *)*plVar11;
        }
        local_e8 = plVar11[1];
        *plVar11 = (long)plVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)&local_110);
      pDVar5 = local_a8->mDocumentProcessor;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_110._M_dataplus._M_p,
                 local_110._M_dataplus._M_p + local_110._M_string_length);
      bVar6 = IFilePartLoader::handleFWLError
                        (&pDVar5->super_IFilePartLoader,ERROR_PARAMETER_COUNT_DOESNOT_MATCH,
                         &local_50,SEVERITY_ERROR_NONCRITICAL);
      *local_d0 = bVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_00794a76;
    }
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    local_a0 = pFVar9;
    goto LAB_00794a76;
  }
  if (parameterName != (String *)0x0) {
    local_110._M_dataplus._M_p = local_110._M_dataplus._M_p & 0xffffffffffffff00;
    getNewParamIndex(this,(Formula *)__from,parameterName,(bool *)&local_110);
    if ((char)local_110._M_dataplus._M_p == '\x01') {
      pFVar9 = (FragmentExpression *)operator_new(0x30);
      MathML::AST::VariableExpression::VariableExpression
                ((VariableExpression *)pFVar9,parameterName);
      *local_d0 = '\x01';
      local_a0 = pFVar9;
      goto LAB_00794a76;
    }
  }
  pSVar10 = DocumentProcessor::resolveSid(this->mDocumentProcessor,sidAddress);
  if (pSVar10 == (SidTreeNode *)0x0) {
    SidAddress::getSidAddressString_abi_cxx11_(&local_c8,sidAddress);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x837c63);
    plVar12 = plVar11 + 2;
    if ((long *)*plVar11 == plVar12) {
      local_e0 = *plVar12;
      lStack_d8 = plVar11[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar12;
      local_f0 = (long *)*plVar11;
    }
    local_e8 = plVar11[1];
    *plVar11 = (long)plVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_110.field_2._M_allocated_capacity = *psVar13;
      local_110.field_2._8_8_ = plVar11[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar13;
      local_110._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_110._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(__from + 0x90) != 0) {
      std::operator+(&local_c8,"referenced in \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (__from + 0x88));
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_c8);
      plVar12 = plVar11 + 2;
      if ((long *)*plVar11 == plVar12) {
        local_e0 = *plVar12;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar12;
        local_f0 = (long *)*plVar11;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_110);
    pDVar5 = this->mDocumentProcessor;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_110._M_dataplus._M_p,
               local_110._M_dataplus._M_p + local_110._M_string_length);
    bVar6 = IFilePartLoader::handleFWLError
                      (&pDVar5->super_IFilePartLoader,ERROR_UNRESOLVED_PARAMETER,&local_90,
                       SEVERITY_ERROR_NONCRITICAL);
    *local_d0 = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    cVar7 = '\x01';
LAB_00794924:
    pFVar9 = (FragmentExpression *)0x0;
  }
  else {
    if (pSVar10->mTargetType == TARGETTYPECLASS_INTERMEDIATETARGETABLE) {
      pAVar4 = (pSVar10->mTarget).animatable;
      if (pAVar4 == (Animatable *)0x0) {
        pAVar14 = (Animatable *)0x0;
      }
      else {
        iVar8 = (*pAVar4->_vptr_Animatable[2])(pAVar4);
        pAVar14 = (Animatable *)0x0;
        if (CONCAT44(extraout_var_02,iVar8) == 1) {
          pAVar14 = pAVar4;
        }
      }
      pFVar9 = (FragmentExpression *)operator_new(0x30);
      COLLADAFW::UniqueId::toAscii_abi_cxx11_
                (&local_110,(UniqueId *)&pAVar14[7].mAnimationList.mObjectId);
      MathML::AST::VariableExpression::VariableExpression((VariableExpression *)pFVar9,&local_110);
    }
    else {
      if (pSVar10->mTargetType != TARGETTYPECLASS_OBJECT) {
        cVar7 = '\0';
        goto LAB_00794924;
      }
      pAVar4 = (pSVar10->mTarget).animatable;
      pFVar9 = (FragmentExpression *)operator_new(0x30);
      iVar8 = (*pAVar4->_vptr_Animatable[3])(pAVar4);
      COLLADAFW::UniqueId::toAscii_abi_cxx11_
                (&local_110,(UniqueId *)CONCAT44(extraout_var_01,iVar8));
      MathML::AST::VariableExpression::VariableExpression((VariableExpression *)pFVar9,&local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    cVar7 = '\x01';
  }
  *local_d0 = cVar7;
  local_a0 = pFVar9;
LAB_00794a76:
  return (int)local_a0;
}

Assistant:

MathML::AST::INode* FormulasLinker::link( COLLADAFW::Formula* formula, COLLADACsymbol* csymbol, bool& success)
	{
		const SidAddress& targetAddress = csymbol->getSidAddress();

		const String* csymbolName = 0;
		// if the address consist of a single word, this is considered to be the csymbol name.
		if ( !targetAddress.getId().empty() && 
			targetAddress.getSids().empty() && 
			targetAddress.getMemberSelection() == SidAddress::MEMBER_SELECTION_NONE )
		{
			csymbolName = &targetAddress.getId();
		}

		if ( csymbol->getCSymbolType() == COLLADACsymbol::FUNCTION )
		{
			const COLLADAFW::UniqueId& formulaUniqueId = csymbol->getFormulaUniqueId();

			COLLADAFW::Formula* targetFormula = mDocumentProcessor->getFormulaByUniqueId(formulaUniqueId);
		
			MathML::AST::FragmentExpression* fragmentExpression = 0;

			if ( targetFormula )
			{
				// find a suitable name for the fragment expression
				// if possible use the string in the csymbol element, otherwise the name of the referenced fromula
				const String* fragmentExpressionName = 0;
				fragmentExpressionName = csymbolName ? csymbolName : &targetFormula->getName();

				fragmentExpression = new MathML::AST::FragmentExpression(*fragmentExpressionName, MathML::AST::INode::CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);
				COLLADAFW::MathmlAstArray& asts = targetFormula->getMathmlAsts();
				if ( asts.getCount() == 1)
				{
					// we have to ensure, that the fragment won't change anymore. Therefore we need to link immediately
					bool fragmentSuccess = true;
					asts[0] = link( targetFormula, asts[0], fragmentSuccess);
					fragmentExpression->setFragment( asts[0] );
					if ( !fragmentSuccess )
					{
						return 0;
					}
				}
				const COLLADACsymbol::ParameterList& parameters =  csymbol->getParameterList();
				const COLLADAFW::FormulaNewParamPointerArray& targetFormulaParameters = targetFormula->getNewParams();
				if ( parameters.size() != targetFormulaParameters.getCount() )
				{
					String msg = "Number of newparams in formula \"" + *fragmentExpressionName;
					const String& formulaName = formula->getName();
					if ( !formulaName.empty() )
					{
						msg.append( "referenced in \"" + formulaName + "\" ");
					}
					msg.append( "does not match parameters count." );

					success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_PARAMETER_COUNT_DOESNOT_MATCH, msg);
				}
				else
				{
					COLLADACsymbol::ParameterList::const_iterator it = parameters.begin();
					for ( size_t i = 0; it!=parameters.end(); ++it, ++i )
					{
						const COLLADAFW::FormulaNewParam* parameter = targetFormulaParameters[i];
						fragmentExpression->addParameter(parameter->getName(), link( formula, *it, success));
						if ( !success )
						{
							break;
						}
					}
				}
			}
			else
			{
				// formula not found
				fragmentExpression = new MathML::AST::FragmentExpression(targetAddress.getSidAddressString(), MathML::AST::INode::CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);

				String msg = "Formula with unique id\"" + formulaUniqueId.toAscii() + "\" ";
				msg.append( "could not be found." );

				success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_UNRESOLVED_FORMULA, msg);
			}
			return fragmentExpression;
		}
		else
		{
			MathML::AST::VariableExpression* variableExpression = 0;

			// the csymbol is a parameter. 
			// if the address consist of a single word, it might be a parameter of the formula itself.
			if ( csymbolName )
			{
				//search for the parameter name in the formulas new params
				bool found = false;
				getNewParamIndex(formula, *csymbolName, found);
				if ( found )
				{
					// we are done. create new VariableExpression and return
					variableExpression = FW_NEW MathML::AST::VariableExpression(*csymbolName);
					success = true;
					return variableExpression;
				}
			}

			// Try to find the referenced parameter in the entire COLLADA file, using ordinary sid address
			// syntax
			const SidTreeNode* targetSidTreeNode = mDocumentProcessor->resolveSid( targetAddress );

			if ( !targetSidTreeNode )
			{
				// parameter not found
				String msg = "Parameter with sid address \"" + targetAddress.getSidAddressString() + "\" ";
				const String& formulaName = formula->getName();
				if ( !formulaName.empty() )
				{
					msg.append( "referenced in \"" + formulaName + "\" ");
				}
				msg.append( "could not be resolved." );

				success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_UNRESOLVED_PARAMETER, msg);
			}
			else
			{
				// parameter found
				if (targetSidTreeNode->getTargetType() == SidTreeNode::TARGETTYPECLASS_OBJECT)
				{
					// the parameter is an object, e.g. a joint
					const COLLADAFW::Object* object = targetSidTreeNode->getObjectTarget();
					COLLADABU_ASSERT(object);
					variableExpression = new MathML::AST::VariableExpression(object->getUniqueId().toAscii());
				}
				else if (targetSidTreeNode->getTargetType() == SidTreeNode::TARGETTYPECLASS_INTERMEDIATETARGETABLE)
				{
					// the parameter is an object, e.g. a joint
					const IntermediateTargetable* intermediateTargetable = targetSidTreeNode->getIntermediateTargetableTarget();
					COLLADABU_ASSERT(intermediateTargetable);
					const KinematicInstance* kinematicInstance = intermediateTargetableSafeCast<KinematicInstance>(intermediateTargetable);
					// for now we only support kinematic instances here
					COLLADABU_ASSERT(kinematicInstance);
					variableExpression = new MathML::AST::VariableExpression(kinematicInstance->getReplacingObjectUniqueId().toAscii());
				}
				else
				{
					// TODO: animatabel not supported yet
					success = false;
					return 0;
				}

			}
			success = true;
			return variableExpression;
		}

		success = false;
		return 0;
	}